

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,NetworkAddress *addr,
                 HttpClientSettings *settings)

{
  NetworkAddressHttpClient *this_00;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar1;
  Own<kj::NetworkAddress,_std::nullptr_t> local_98;
  Own<kj::NetworkAddress,_std::nullptr_t> local_88;
  HttpHeaderTable *local_78;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> local_70;
  HttpClientSettings local_60;
  
  local_98.disposer = (Disposer *)&NullDisposer::instance;
  local_98.ptr = addr;
  local_78 = responseHeaderTable;
  this_00 = (NetworkAddressHttpClient *)operator_new(200);
  local_88.disposer = (Disposer *)&NullDisposer::instance;
  local_98.ptr = (NetworkAddress *)0x0;
  local_88.ptr = addr;
  HttpClientSettings::HttpClientSettings(&local_60,settings);
  anon_unknown_36::NetworkAddressHttpClient::NetworkAddressHttpClient
            (this_00,timer,local_78,&local_88,&local_60);
  local_70.disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::instance;
  local_70.ptr = this_00;
  Own<kj::NetworkAddress,_std::nullptr_t>::dispose(&local_88);
  *(undefined8 **)this =
       &_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::instance;
  *(NetworkAddressHttpClient **)(this + 8) = this_00;
  local_70.ptr = (NetworkAddressHttpClient *)0x0;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::~Own(&local_70);
  Own<kj::NetworkAddress,_std::nullptr_t>::dispose(&local_98);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::NetworkAddress& addr, HttpClientSettings settings) {
  return kj::heap<NetworkAddressHttpClient>(timer, responseHeaderTable,
      kj::Own<kj::NetworkAddress>(&addr, kj::NullDisposer::instance), kj::mv(settings));
}